

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O0

void __thiscall mp::pre::ValuePresolverImpl::CleanUpValueNodes(ValuePresolverImpl *this)

{
  bool bVar1;
  ValueNode *this_00;
  _Node_iterator_base<mp::pre::ValueNode_*,_false> this_01;
  long in_RDI;
  value_type pvn;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<mp::pre::ValueNode_*,_std::hash<mp::pre::ValueNode_*>,_std::equal_to<mp::pre::ValueNode_*>,_std::allocator<mp::pre::ValueNode_*>_>
  *__range2;
  unordered_set<mp::pre::ValueNode_*,_std::hash<mp::pre::ValueNode_*>,_std::equal_to<mp::pre::ValueNode_*>,_std::allocator<mp::pre::ValueNode_*>_>
  *in_stack_ffffffffffffffd8;
  _Node_iterator_base<mp::pre::ValueNode_*,_false> local_18;
  
  this_00 = (ValueNode *)(in_RDI + 0x10);
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_set<mp::pre::ValueNode_*,_std::hash<mp::pre::ValueNode_*>,_std::equal_to<mp::pre::ValueNode_*>,_std::allocator<mp::pre::ValueNode_*>_>
       ::begin(in_stack_ffffffffffffffd8);
  this_01._M_cur =
       (__node_type *)
       std::
       unordered_set<mp::pre::ValueNode_*,_std::hash<mp::pre::ValueNode_*>,_std::equal_to<mp::pre::ValueNode_*>,_std::allocator<mp::pre::ValueNode_*>_>
       ::end(in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&local_18,
                       (_Node_iterator_base<mp::pre::ValueNode_*,_false> *)&stack0xffffffffffffffe0)
    ;
    if (!bVar1) break;
    std::__detail::_Node_const_iterator<mp::pre::ValueNode_*,_true,_false>::operator*
              ((_Node_const_iterator<mp::pre::ValueNode_*,_true,_false> *)0x1844a4);
    ValueNode::CleanUpAndRealloc(this_00);
    std::__detail::_Node_const_iterator<mp::pre::ValueNode_*,_true,_false>::operator++
              ((_Node_const_iterator<mp::pre::ValueNode_*,_true,_false> *)this_01._M_cur);
  }
  return;
}

Assistant:

void CleanUpValueNodes() const {
    for (auto pvn: val_nodes_)
      pvn->CleanUpAndRealloc();
  }